

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cordz_info.cc
# Opt level: O2

void __thiscall absl::cord_internal::CordzInfo::Track(CordzInfo *this)

{
  List *this_00;
  __pointer_type pCVar1;
  
  this_00 = this->list_;
  base_internal::SpinLock::Lock(&this_00->mutex);
  pCVar1 = (this->list_->head)._M_b._M_p;
  if (pCVar1 != (__pointer_type)0x0) {
    (pCVar1->ci_prev_)._M_b._M_p = this;
  }
  (this->ci_next_)._M_b._M_p = pCVar1;
  (this->list_->head)._M_b._M_p = this;
  base_internal::SpinLock::Unlock(&this_00->mutex);
  return;
}

Assistant:

void CordzInfo::Track() {
  SpinLockHolder l(&list_->mutex);

  CordzInfo* const head = list_->head.load(std::memory_order_acquire);
  if (head != nullptr) {
    head->ci_prev_.store(this, std::memory_order_release);
  }
  ci_next_.store(head, std::memory_order_release);
  list_->head.store(this, std::memory_order_release);
}